

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean mh2ad(Integer memhandle,AD **adout,BlockLocation location,char *caller)

{
  bool bVar1;
  ulong handle;
  Boolean BVar2;
  AD *ad_00;
  ulongi uVar3;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  Boolean check_heapandstack;
  Boolean check_stacktop;
  Boolean check_stack;
  Boolean check_heap;
  Boolean check_guards;
  Boolean check_checksum;
  AD *ad;
  char *emsg;
  char *func;
  long lVar4;
  Boolean local_8;
  
  bVar1 = false;
  lVar4 = 0;
  func = (char *)0x0;
  emsg = (char *)0x0;
  handle = (ulong)in_EDX;
  switch(handle) {
  case 0:
    emsg = (char *)0x1;
    break;
  case 1:
    bVar1 = true;
    break;
  case 2:
    lVar4 = 1;
    break;
  case 3:
    func = (char *)0x1;
    break;
  default:
    sprintf(ma_ebuf,"invalid location: %d",(ulong)in_EDX);
    ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
    return 0;
  }
  BVar2 = ma_table_verify((Integer)func,emsg);
  if (BVar2 == 0) {
    local_8 = 0;
  }
  else {
    ad_00 = (AD *)ma_table_lookup(handle);
    if ((ad_00 < ma_segment) || (ma_eos <= ad_00)) {
      sprintf(ma_ebuf,"invalid block address (0x%lx) for memhandle %ld",ad_00,in_RDI);
      ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
      local_8 = 0;
    }
    else {
      uVar3 = checksum(ad_00);
      if (uVar3 == ad_00->checksum) {
        BVar2 = guard_check(ad_00);
        if (BVar2 == 0) {
          sprintf(ma_ebuf,"invalid guard(s) for memhandle %ld (name: \'%s\')",in_RDI,ad_00->name);
          ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
          local_8 = 0;
        }
        else {
          if (bVar1) {
            BVar2 = list_member(ad_00,ma_hused);
            if (BVar2 == 0) {
              sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not in heap",in_RDI,ad_00->name);
              ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
              return 0;
            }
          }
          else if (lVar4 == 0) {
            if (func == (char *)0x0) {
              if (((emsg != (char *)0x0) && (BVar2 = list_member(ad_00,ma_hused), BVar2 == 0)) &&
                 (BVar2 = list_member(ad_00,ma_sused), BVar2 == 0)) {
                sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not in heap or stack",in_RDI,
                        ad_00->name);
                ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
                return 0;
              }
            }
            else {
              BVar2 = list_member(ad_00,ma_sused);
              if (BVar2 == 0) {
                sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not in stack",in_RDI,ad_00->name);
                ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
                return 0;
              }
              if (ad_00 != (AD *)ma_sp) {
                sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not top of stack",in_RDI,ad_00->name);
                ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
                return 0;
              }
            }
          }
          else {
            BVar2 = list_member(ad_00,ma_sused);
            if (BVar2 == 0) {
              sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not in stack",in_RDI,ad_00->name);
              ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
              return 0;
            }
          }
          *in_RSI = ad_00;
          local_8 = 1;
        }
      }
      else {
        sprintf(ma_ebuf,"invalid checksum for memhandle %ld (name: \'%s\')",in_RDI,ad_00->name);
        ma_error((ErrorLevel)((ulong)lVar4 >> 0x20),(ErrorType)lVar4,func,emsg);
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

private Boolean mh2ad(memhandle, adout, location, caller)
    Integer    memhandle;    /* the handle to verify and convert */
    AD        **adout;    /* RETURN: AD corresponding to memhandle */
    BlockLocation location;    /* where AD must reside */
    char    *caller;    /* name of calling routine */
{
    AD        *ad;
    Boolean    check_checksum = MA_TRUE;
    Boolean    check_guards = MA_TRUE;
    Boolean    check_heap = MA_FALSE;
    Boolean    check_stack = MA_FALSE;
    Boolean    check_stacktop = MA_FALSE;
    Boolean    check_heapandstack = MA_FALSE;

    switch (location)
    {
        case BL_HeapOrStack:
            check_heapandstack = MA_TRUE;
            break;
        case BL_Heap:
            check_heap = MA_TRUE;
            break;
        case BL_Stack:
            check_stack = MA_TRUE;
            break;
        case BL_StackTop:
            check_stacktop = MA_TRUE;
            break;
        default:
            (void)sprintf(ma_ebuf,
                "invalid location: %d",
                (int)location);
            ma_error(EL_Nonfatal, ET_Internal, "mh2ad", ma_ebuf);
            return MA_FALSE;
    }

    /* convert memhandle to AD */
    if (!ma_table_verify(memhandle, caller))
        return MA_FALSE;
    else
        ad = (AD *)ma_table_lookup(memhandle);

    /* attempt to avoid crashes due to corrupt addresses */
    if (!reasonable_address((Pointer)ad))
    {
        (void)sprintf(ma_ebuf,
            "invalid block address (0x%lx) for memhandle %ld",
            (size_t)ad, (size_t)memhandle);
        ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
        return MA_FALSE;
    }

    if (check_checksum)
    {
        if (checksum(ad) != ad->checksum)
        {
            (void)sprintf(ma_ebuf,
                "invalid checksum for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_guards)
    {
        if (!guard_check(ad))
        {
            (void)sprintf(ma_ebuf,
                "invalid guard(s) for memhandle %ld (name: '%s')",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    if (check_heap)
    {
        if (!list_member(ad, ma_hused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stack)
    {
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_stacktop)
    {
        /* is it in the stack? */
        if (!list_member(ad, ma_sused))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }

        /* is it on top of the stack? */
        if ((Pointer)ad != ma_sp)
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not top of stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }
    else if (check_heapandstack)
    {
        if ((!list_member(ad, ma_hused)) && (!list_member(ad, ma_sused)))
        {
            (void)sprintf(ma_ebuf,
                "memhandle %ld (name: '%s') not in heap or stack",
                (size_t)memhandle, ad->name);
            ma_error(EL_Nonfatal, ET_External, caller, ma_ebuf);
            return MA_FALSE;
        }
    }

    /* ad is valid */
    *adout = ad;
    return MA_TRUE;
}